

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXAnimation.cpp
# Opt level: O1

void __thiscall
Assimp::FBX::AnimationCurveNode::AnimationCurveNode
          (AnimationCurveNode *this,uint64_t id,Element *element,string *name,Document *doc,
          char **target_prop_whitelist,size_t whitelist_size)

{
  _Rb_tree_header *p_Var1;
  Connection *this_00;
  char *__s1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  Document *doc_00;
  int iVar4;
  Object *pOVar5;
  range_error *this_02;
  pointer ppCVar6;
  size_t sVar7;
  char *whitelist [3];
  string local_c8;
  Element *local_a8;
  string *local_a0;
  Object **local_98;
  pointer local_90;
  string *local_88;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> local_80
  ;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  Scope *local_58;
  Document *local_50;
  char *local_48;
  char *pcStack_40;
  char *local_38;
  
  Object::Object(&this->super_Object,id,element,name);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__AnimationCurveNode_008f3a40;
  p_Var1 = &(this->curves)._M_t._M_impl.super__Rb_tree_header;
  (this->curves)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->curves)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->target = (Object *)0x0;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->curves)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->curves)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->curves)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a0 = (string *)&this->prop;
  (this->prop)._M_dataplus._M_p = (pointer)&(this->prop).field_2;
  (this->prop)._M_string_length = 0;
  (this->prop).field_2._M_local_buf[0] = '\0';
  this->doc = doc;
  local_a8 = element;
  local_58 = GetRequiredScope(element);
  local_38 = "Deformer";
  local_48 = "Model";
  pcStack_40 = "NodeAttribute";
  local_50 = doc;
  Document::GetConnectionsBySourceSequenced(&local_80,doc,(this->super_Object).id,&local_48,3);
  local_98 = &this->target;
  local_90 = local_80.
             super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppCVar6 = local_80.
            super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_80.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_80.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      this_00 = *ppCVar6;
      if ((this_00->prop)._M_string_length != 0) {
        local_88 = &this_00->prop;
        if (target_prop_whitelist != (char **)0x0) {
          if (whitelist_size == 0) {
LAB_00614605:
            this_02 = (range_error *)__cxa_allocate_exception(0x10);
            std::range_error::range_error
                      (this_02,"AnimationCurveNode target property is not in whitelist");
            __cxa_throw(this_02,&std::range_error::typeinfo,std::range_error::~range_error);
          }
          __s1 = (local_88->_M_dataplus)._M_p;
          sVar7 = 0;
          while (iVar4 = strcmp(__s1,target_prop_whitelist[sVar7]), iVar4 != 0) {
            sVar7 = sVar7 + 1;
            if (whitelist_size == sVar7) goto LAB_00614605;
          }
        }
        pOVar5 = Connection::DestinationObject(this_00);
        if (pOVar5 == (Object *)0x0) {
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c8,
                     "failed to read destination object for AnimationCurveNode->Model link, ignoring"
                     ,"");
          Util::DOMWarning(&local_c8,local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          *local_98 = pOVar5;
          std::__cxx11::string::_M_assign(local_a0);
        }
        if (pOVar5 != (Object *)0x0) break;
      }
      ppCVar6 = ppCVar6 + 1;
    } while (ppCVar6 != local_90);
  }
  doc_00 = local_50;
  if (*local_98 == (Object *)0x0) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,
               "failed to resolve target Model/NodeAttribute/Constraint for AnimationCurveNode","");
    Util::DOMWarning(&local_c8,local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c8,"AnimationCurveNode.FbxAnimCurveNode","");
  Util::GetPropertyTable((Util *)&local_68,doc_00,&local_c8,local_a8,local_58,false);
  p_Var3 = p_Stack_60;
  peVar2 = local_68;
  local_68 = (element_type *)0x0;
  p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_01 = (this->props).
            super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar2;
  (this->props).super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var3;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_80.
      super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.
                    super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.
                          super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.
                          super__Vector_base<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

AnimationCurveNode::AnimationCurveNode(uint64_t id, const Element& element, const std::string& name, 
        const Document& doc, const char* const * target_prop_whitelist /*= NULL*/, 
        size_t whitelist_size /*= 0*/)
: Object(id, element, name)
, target()
, doc(doc)
{
    const Scope& sc = GetRequiredScope(element);

    // find target node
    const char* whitelist[] = {"Model","NodeAttribute","Deformer"};
    const std::vector<const Connection*>& conns = doc.GetConnectionsBySourceSequenced(ID(),whitelist,3);

    for(const Connection* con : conns) {

        // link should go for a property
        if (!con->PropertyName().length()) {
            continue;
        }

        if(target_prop_whitelist) {
            const char* const s = con->PropertyName().c_str();
            bool ok = false;
            for (size_t i = 0; i < whitelist_size; ++i) {
                if (!strcmp(s, target_prop_whitelist[i])) {
                    ok = true;
                    break;
                }
            }

            if (!ok) {
                throw std::range_error("AnimationCurveNode target property is not in whitelist");
            }
        }

        const Object* const ob = con->DestinationObject();
        if(!ob) {
            DOMWarning("failed to read destination object for AnimationCurveNode->Model link, ignoring",&element);
            continue;
        }

        // XXX support constraints as DOM class
        //ai_assert(dynamic_cast<const Model*>(ob) || dynamic_cast<const NodeAttribute*>(ob));
        target = ob;
        if(!target) {
            continue;
        }

        prop = con->PropertyName();
        break;
    }

    if(!target) {
        DOMWarning("failed to resolve target Model/NodeAttribute/Constraint for AnimationCurveNode",&element);
    }

    props = GetPropertyTable(doc,"AnimationCurveNode.FbxAnimCurveNode",element,sc,false);
}